

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_1144a71::Target::DumpDefine
          (Value *__return_storage_ptr__,Target *this,
          JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *def
          )

{
  Value *this_00;
  Value local_50;
  undefined1 local_21;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_20;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *def_local;
  Target *this_local;
  Value *define;
  
  local_21 = 0;
  local_20 = def;
  def_local = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_50,&local_20->Value);
  this_00 = Json::Value::operator[](__return_storage_ptr__,"define");
  Json::Value::operator=(this_00,&local_50);
  Json::Value::~Value(&local_50);
  AddBacktrace(this,__return_storage_ptr__,(JBTIndex)(local_20->Backtrace).Index);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpDefine(JBT<std::string> const& def)
{
  Json::Value define = Json::objectValue;
  define["define"] = def.Value;
  this->AddBacktrace(define, def.Backtrace);
  return define;
}